

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_event_visitor.hpp
# Opt level: O2

bool __thiscall
jsoncons::basic_item_event_visitor<char>::visit_typed_array
          (basic_item_event_visitor<char> *this,span<const_unsigned_int,_18446744073709551615UL> *s,
          semantic_tag tag,ser_context *context,error_code *ec)

{
  undefined7 in_register_00000011;
  uint *puVar1;
  
  (*this->_vptr_basic_item_event_visitor[7])(this,s->size_,CONCAT71(in_register_00000011,tag));
  if (ec->_M_value == 0) {
    puVar1 = s->data_;
    do {
      if (puVar1 == s->data_ + s->size_) {
        (*this->_vptr_basic_item_event_visitor[8])(this,context,ec);
        return true;
      }
      (*this->_vptr_basic_item_event_visitor[0xe])(this,(ulong)*puVar1,0,context,ec);
      puVar1 = puVar1 + 1;
    } while (ec->_M_value == 0);
  }
  return true;
}

Assistant:

virtual JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(const jsoncons::span<const uint32_t>& s, 
            semantic_tag tag,
            const ser_context& context, 
            std::error_code& ec) 
        {
            begin_array(s.size(), tag, context, ec);
            if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            for (auto p = s.begin(); p != s.end(); ++p)
            {
                uint64_value(*p, semantic_tag::none, context, ec);
                if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            }
            end_array(context, ec);
            JSONCONS_VISITOR_RETURN;
        }